

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_DRBG.c
# Opt level: O0

_Bool instantiate_sha1(EverCrypt_DRBG_state_s *st,uint8_t *personalization_string,
                      uint32_t personalization_string_len)

{
  undefined8 uVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  long lVar4;
  uint8_t *puVar5;
  _Bool _Var6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint len;
  uint8_t *__src;
  ulong uVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  uint8_t auStack_110 [8];
  uint8_t *local_108;
  uint8_t *local_100;
  uint8_t *local_f8;
  uint8_t *local_f0;
  uint8_t *local_e8;
  uint8_t *k_0;
  unsigned_long __vla_expr3;
  uint local_cc;
  uint8_t *puStack_c8;
  uint32_t input_len0;
  uint8_t *k_;
  unsigned_long __vla_expr2;
  uint32_t *puStack_b0;
  uint32_t input_len;
  uint32_t *ctr;
  uint8_t *v;
  uint8_t *k;
  Hacl_HMAC_DRBG_state scrut;
  unsigned_long __vla_expr1;
  EverCrypt_DRBG_state_s st_s;
  uint8_t *nonce;
  uint8_t *entropy_input;
  _Bool ok;
  unsigned_long __vla_expr0;
  uint32_t min_entropy;
  uint32_t nonce_len;
  uint32_t entropy_input_len;
  uint32_t personalization_string_len_local;
  uint8_t *personalization_string_local;
  EverCrypt_DRBG_state_s *st_local;
  
  if (Hacl_HMAC_DRBG_max_personalization_string_length < personalization_string_len) {
    st_local._7_1_ = false;
  }
  else {
    auStack_110[0] = 0xa7;
    auStack_110[1] = 0x95;
    auStack_110[2] = '(';
    auStack_110[3] = '\0';
    auStack_110[4] = '\0';
    auStack_110[5] = '\0';
    auStack_110[6] = '\0';
    auStack_110[7] = '\0';
    uVar7 = Hacl_HMAC_DRBG_min_length('\x04');
    auStack_110[0] = 0xb4;
    auStack_110[1] = 0x95;
    auStack_110[2] = '(';
    auStack_110[3] = '\0';
    auStack_110[4] = '\0';
    auStack_110[5] = '\0';
    auStack_110[6] = '\0';
    auStack_110[7] = '\0';
    uVar8 = Hacl_HMAC_DRBG_min_length('\x04');
    uVar9 = uVar8 >> 1;
    len = uVar7 + uVar9;
    lVar4 = -((ulong)len + 0xf & 0xfffffffffffffff0);
    puVar13 = (uint8_t *)((long)&local_108 + lVar4);
    puVar11 = auStack_110 + lVar4;
    local_f0 = puVar13;
    puVar11[0] = '*';
    puVar11[1] = 0x96;
    puVar11[2] = '(';
    puVar11[3] = '\0';
    puVar11[4] = '\0';
    puVar11[5] = '\0';
    puVar11[6] = '\0';
    puVar11[7] = '\0';
    memset(puVar13,0,(ulong)len);
    puVar14 = local_f0;
    puVar12 = auStack_110 + lVar4;
    puVar12[0] = '9';
    puVar12[1] = 0x96;
    puVar12[2] = '(';
    puVar12[3] = '\0';
    puVar12[4] = '\0';
    puVar12[5] = '\0';
    puVar12[6] = '\0';
    puVar12[7] = '\0';
    _Var6 = Lib_RandomBuffer_System_randombytes(puVar14,len);
    puVar14 = local_f0;
    if (_Var6) {
      __src = local_f0 + uVar7;
      uVar1 = *(undefined8 *)st;
      puVar15 = (st->field_1).case_SHA1_s.k;
      puVar2 = (uint32_t *)(st->field_1).case_SHA1_s.v;
      puVar3 = (st->field_1).case_SHA1_s.reseed_counter;
      scrut.reseed_counter = (uint32_t *)(ulong)(uVar7 + uVar9 + personalization_string_len);
      puVar13 = puVar13 + -((long)scrut.reseed_counter + 0xfU & 0xfffffffffffffff0);
      local_f8 = puVar13;
      puVar13[-8] = '\t';
      puVar13[-7] = 0x97;
      puVar13[-6] = '(';
      puVar13[-5] = '\0';
      puVar13[-4] = '\0';
      puVar13[-3] = '\0';
      puVar13[-2] = '\0';
      puVar13[-1] = '\0';
      memset(puVar13,0,(ulong)(uVar7 + uVar9 + personalization_string_len));
      puVar5 = local_f8;
      puVar13[-8] = '\"';
      puVar13[-7] = 0x97;
      puVar13[-6] = '(';
      puVar13[-5] = '\0';
      puVar13[-4] = '\0';
      puVar13[-3] = '\0';
      puVar13[-2] = '\0';
      puVar13[-1] = '\0';
      memcpy(puVar5,puVar14,(ulong)uVar7);
      puVar14 = local_f8 + uVar7;
      puVar13[-8] = 'A';
      puVar13[-7] = 0x97;
      puVar13[-6] = '(';
      puVar13[-5] = '\0';
      puVar13[-4] = '\0';
      puVar13[-3] = '\0';
      puVar13[-2] = '\0';
      puVar13[-1] = '\0';
      memcpy(puVar14,__src,(ulong)uVar9);
      puVar14 = local_f8 + (ulong)uVar9 + (ulong)uVar7;
      puVar13[-8] = 'f';
      puVar13[-7] = 0x97;
      puVar13[-6] = '(';
      puVar13[-5] = '\0';
      puVar13[-4] = '\0';
      puVar13[-3] = '\0';
      puVar13[-2] = '\0';
      puVar13[-1] = '\0';
      memcpy(puVar14,personalization_string,(ulong)personalization_string_len);
      __vla_expr1._0_1_ = (char)uVar1;
      if ((char)__vla_expr1 != '\0') {
        puVar13[-8] = 0xb0;
        puVar13[-7] = 0x97;
        puVar13[-6] = '(';
        puVar13[-5] = '\0';
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        printf("KaRaMeL abort at %s:%d\n%s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_DRBG.c"
               ,0x118,"unreachable (pattern matches are exhaustive in F*)");
        puVar13[-8] = 0xba;
        puVar13[-7] = 0x97;
        puVar13[-6] = '(';
        puVar13[-5] = '\0';
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        exit(0xff);
      }
      puStack_b0 = puVar3;
      ctr = puVar2;
      v = puVar15;
      k = puVar15;
      scrut.k = (uint8_t *)puVar2;
      scrut.v = (uint8_t *)puVar3;
      puVar13[-8] = 0xf4;
      puVar13[-7] = 0x97;
      puVar13[-6] = '(';
      puVar13[-5] = '\0';
      puVar13[-4] = '\0';
      puVar13[-3] = '\0';
      puVar13[-2] = '\0';
      puVar13[-1] = '\0';
      memset(puVar15,0,0x14);
      puVar2 = ctr;
      puVar13[-8] = '\n';
      puVar13[-7] = 0x98;
      puVar13[-6] = '(';
      puVar13[-5] = '\0';
      puVar13[-4] = '\0';
      puVar13[-3] = '\0';
      puVar13[-2] = '\0';
      puVar13[-1] = '\0';
      memset(puVar2,1,0x14);
      *puStack_b0 = 1;
      __vla_expr2._4_4_ = uVar7 + 0x15 + uVar9 + personalization_string_len;
      k_ = (uint8_t *)(ulong)__vla_expr2._4_4_;
      puVar13 = puVar13 + -((ulong)(k_ + 0xf) & 0xfffffffffffffff0);
      uVar10 = (ulong)__vla_expr2._4_4_;
      local_100 = puVar13;
      puVar13[-8] = 0x98;
      puVar13[-7] = 0x98;
      puVar13[-6] = '(';
      puVar13[-5] = '\0';
      puVar13[-4] = '\0';
      puVar13[-3] = '\0';
      puVar13[-2] = '\0';
      puVar13[-1] = '\0';
      memset(puVar13,0,uVar10);
      puVar2 = ctr;
      puVar14 = local_100;
      puStack_c8 = local_100;
      *(undefined8 *)local_100 = *(undefined8 *)ctr;
      *(undefined8 *)(puVar14 + 8) = *(undefined8 *)(puVar2 + 2);
      *(uint32_t *)(puVar14 + 0x10) = puVar2[4];
      puVar14 = local_f8;
      if (uVar7 + uVar9 + personalization_string_len != 0) {
        puVar15 = local_100 + 0x15;
        puVar13[-8] = 0xfe;
        puVar13[-7] = 0x98;
        puVar13[-6] = '(';
        puVar13[-5] = '\0';
        puVar13[-4] = '\0';
        puVar13[-3] = '\0';
        puVar13[-2] = '\0';
        puVar13[-1] = '\0';
        memcpy(puVar15,puVar14,(ulong)(uVar7 + uVar9 + personalization_string_len));
      }
      puVar14 = local_100;
      local_100[0x14] = '\0';
      puVar5 = v;
      uVar8 = __vla_expr2._4_4_;
      puVar15 = puStack_c8;
      puVar13[-8] = '(';
      puVar13[-7] = 0x99;
      puVar13[-6] = '(';
      puVar13[-5] = '\0';
      puVar13[-4] = '\0';
      puVar13[-3] = '\0';
      puVar13[-2] = '\0';
      puVar13[-1] = '\0';
      EverCrypt_HMAC_compute_sha1(puVar15,puVar5,0x14,puVar14,uVar8);
      puVar2 = ctr;
      puVar14 = puStack_c8;
      puVar13[-8] = 'K';
      puVar13[-7] = 0x99;
      puVar13[-6] = '(';
      puVar13[-5] = '\0';
      puVar13[-4] = '\0';
      puVar13[-3] = '\0';
      puVar13[-2] = '\0';
      puVar13[-1] = '\0';
      EverCrypt_HMAC_compute_sha1((uint8_t *)puVar2,puVar14,0x14,(uint8_t *)puVar2,0x14);
      *(undefined8 *)v = *(undefined8 *)puStack_c8;
      *(undefined8 *)(v + 8) = *(undefined8 *)(puStack_c8 + 8);
      *(undefined4 *)(v + 0x10) = *(undefined4 *)(puStack_c8 + 0x10);
      if (uVar7 + uVar9 + personalization_string_len != 0) {
        local_cc = uVar7 + 0x15 + uVar9 + personalization_string_len;
        k_0 = (uint8_t *)(ulong)local_cc;
        puVar15 = puVar13 + -((ulong)(k_0 + 0xf) & 0xfffffffffffffff0);
        uVar10 = (ulong)local_cc;
        local_108 = puVar15;
        __vla_expr3 = (unsigned_long)puVar13;
        puVar15[-8] = '\n';
        puVar15[-7] = 0x9a;
        puVar15[-6] = '(';
        puVar15[-5] = '\0';
        puVar15[-4] = '\0';
        puVar15[-3] = '\0';
        puVar15[-2] = '\0';
        puVar15[-1] = '\0';
        memset(puVar15,0,uVar10);
        puVar2 = ctr;
        puVar14 = local_108;
        local_e8 = local_108;
        *(undefined8 *)local_108 = *(undefined8 *)ctr;
        *(undefined8 *)(puVar14 + 8) = *(undefined8 *)(puVar2 + 2);
        *(uint32_t *)(puVar14 + 0x10) = puVar2[4];
        puVar14 = local_f8;
        if (uVar7 + uVar9 + personalization_string_len != 0) {
          puVar13 = local_108 + 0x15;
          puVar15[-8] = 'p';
          puVar15[-7] = 0x9a;
          puVar15[-6] = '(';
          puVar15[-5] = '\0';
          puVar15[-4] = '\0';
          puVar15[-3] = '\0';
          puVar15[-2] = '\0';
          puVar15[-1] = '\0';
          memcpy(puVar13,puVar14,(ulong)(uVar7 + uVar9 + personalization_string_len));
        }
        puVar14 = local_108;
        local_108[0x14] = '\x01';
        puVar5 = v;
        uVar9 = local_cc;
        puVar13 = local_e8;
        puVar15[-8] = 0x9a;
        puVar15[-7] = 0x9a;
        puVar15[-6] = '(';
        puVar15[-5] = '\0';
        puVar15[-4] = '\0';
        puVar15[-3] = '\0';
        puVar15[-2] = '\0';
        puVar15[-1] = '\0';
        EverCrypt_HMAC_compute_sha1(puVar13,puVar5,0x14,puVar14,uVar9);
        puVar2 = ctr;
        puVar14 = local_e8;
        puVar15[-8] = 0xbd;
        puVar15[-7] = 0x9a;
        puVar15[-6] = '(';
        puVar15[-5] = '\0';
        puVar15[-4] = '\0';
        puVar15[-3] = '\0';
        puVar15[-2] = '\0';
        puVar15[-1] = '\0';
        EverCrypt_HMAC_compute_sha1((uint8_t *)puVar2,puVar14,0x14,(uint8_t *)puVar2,0x14);
        *(undefined8 *)v = *(undefined8 *)local_e8;
        *(undefined8 *)(v + 8) = *(undefined8 *)(local_e8 + 8);
        *(undefined4 *)(v + 0x10) = *(undefined4 *)(local_e8 + 0x10);
      }
      st_local._7_1_ = true;
    }
    else {
      st_local._7_1_ = false;
    }
  }
  return st_local._7_1_;
}

Assistant:

static bool
instantiate_sha1(
  EverCrypt_DRBG_state_s *st,
  uint8_t *personalization_string,
  uint32_t personalization_string_len
)
{
  if (personalization_string_len > Hacl_HMAC_DRBG_max_personalization_string_length)
  {
    return false;
  }
  uint32_t entropy_input_len = Hacl_HMAC_DRBG_min_length(Spec_Hash_Definitions_SHA1);
  uint32_t nonce_len = Hacl_HMAC_DRBG_min_length(Spec_Hash_Definitions_SHA1) / 2U;
  uint32_t min_entropy = entropy_input_len + nonce_len;
  KRML_CHECK_SIZE(sizeof (uint8_t), min_entropy);
  uint8_t entropy[min_entropy];
  memset(entropy, 0U, min_entropy * sizeof (uint8_t));
  bool ok = Lib_RandomBuffer_System_randombytes(entropy, min_entropy);
  if (!ok)
  {
    return false;
  }
  uint8_t *entropy_input = entropy;
  uint8_t *nonce = entropy + entropy_input_len;
  EverCrypt_DRBG_state_s st_s = *st;
  KRML_CHECK_SIZE(sizeof (uint8_t), entropy_input_len + nonce_len + personalization_string_len);
  uint8_t seed_material[entropy_input_len + nonce_len + personalization_string_len];
  memset(seed_material,
    0U,
    (entropy_input_len + nonce_len + personalization_string_len) * sizeof (uint8_t));
  memcpy(seed_material, entropy_input, entropy_input_len * sizeof (uint8_t));
  memcpy(seed_material + entropy_input_len, nonce, nonce_len * sizeof (uint8_t));
  memcpy(seed_material + entropy_input_len + nonce_len,
    personalization_string,
    personalization_string_len * sizeof (uint8_t));
  Hacl_HMAC_DRBG_state scrut;
  if (st_s.tag == SHA1_s)
  {
    scrut = st_s.case_SHA1_s;
  }
  else
  {
    scrut = KRML_EABORT(Hacl_HMAC_DRBG_state, "unreachable (pattern matches are exhaustive in F*)");
  }
  uint8_t *k = scrut.k;
  uint8_t *v = scrut.v;
  uint32_t *ctr = scrut.reseed_counter;
  memset(k, 0U, 20U * sizeof (uint8_t));
  memset(v, 1U, 20U * sizeof (uint8_t));
  ctr[0U] = 1U;
  uint32_t input_len = 21U + entropy_input_len + nonce_len + personalization_string_len;
  KRML_CHECK_SIZE(sizeof (uint8_t), input_len);
  uint8_t input0[input_len];
  memset(input0, 0U, input_len * sizeof (uint8_t));
  uint8_t *k_ = input0;
  memcpy(k_, v, 20U * sizeof (uint8_t));
  if (entropy_input_len + nonce_len + personalization_string_len != 0U)
  {
    memcpy(input0 + 21U,
      seed_material,
      (entropy_input_len + nonce_len + personalization_string_len) * sizeof (uint8_t));
  }
  input0[20U] = 0U;
  EverCrypt_HMAC_compute_sha1(k_, k, 20U, input0, input_len);
  EverCrypt_HMAC_compute_sha1(v, k_, 20U, v, 20U);
  memcpy(k, k_, 20U * sizeof (uint8_t));
  if (entropy_input_len + nonce_len + personalization_string_len != 0U)
  {
    uint32_t input_len0 = 21U + entropy_input_len + nonce_len + personalization_string_len;
    KRML_CHECK_SIZE(sizeof (uint8_t), input_len0);
    uint8_t input[input_len0];
    memset(input, 0U, input_len0 * sizeof (uint8_t));
    uint8_t *k_0 = input;
    memcpy(k_0, v, 20U * sizeof (uint8_t));
    if (entropy_input_len + nonce_len + personalization_string_len != 0U)
    {
      memcpy(input + 21U,
        seed_material,
        (entropy_input_len + nonce_len + personalization_string_len) * sizeof (uint8_t));
    }
    input[20U] = 1U;
    EverCrypt_HMAC_compute_sha1(k_0, k, 20U, input, input_len0);
    EverCrypt_HMAC_compute_sha1(v, k_0, 20U, v, 20U);
    memcpy(k, k_0, 20U * sizeof (uint8_t));
  }
  return true;
}